

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.hpp
# Opt level: O0

void __thiscall helics::DependencyInfo::DependencyInfo(DependencyInfo *this,GlobalFederateId id)

{
  bool bVar1;
  BaseType in_ESI;
  long in_RDI;
  TimeData *unaff_retaddr;
  GlobalFederateId local_4;
  
  local_4.gid = in_ESI;
  TimeData::TimeData(unaff_retaddr);
  *(BaseType *)(in_RDI + 0x48) = local_4.gid;
  *(undefined1 *)(in_RDI + 0x4c) = 0;
  *(undefined1 *)(in_RDI + 0x4d) = 0;
  *(undefined1 *)(in_RDI + 0x4e) = 0;
  *(undefined1 *)(in_RDI + 0x4f) = 0;
  bVar1 = GlobalFederateId::isBroker(&local_4);
  *(bool *)(in_RDI + 0x50) = bVar1;
  *(undefined1 *)(in_RDI + 0x51) = 0;
  *(undefined1 *)(in_RDI + 0x52) = 0;
  *(undefined1 *)(in_RDI + 0x53) = 0;
  return;
}

Assistant:

explicit DependencyInfo(GlobalFederateId id): fedID(id), forwarding{id.isBroker()} {}